

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lipm-dcm-estimator.cpp
# Opt level: O0

void __thiscall
stateObservation::LipmDcmEstimator::setUnbiasedDCM
          (LipmDcmEstimator *this,Vector2 *dcm,Vector2 *uncertainty)

{
  Matrix<double,__1,__1,_0,__1,__1> local_1a0;
  Block<Eigen::Matrix<double,4,4,0,4,4>,2,2,false> local_188 [48];
  DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> local_158 [40];
  DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_2,_2,_false>_> local_130 [48];
  DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_2,_2,_false>_> local_100 [64];
  Matrix<double,__1,__1,_0,__1,__1> local_c0;
  Matrix<double,4,4,0,4,4> local_a8 [8];
  Matrix4 P;
  Vector2 *uncertainty_local;
  Vector2 *dcm_local;
  LipmDcmEstimator *this_local;
  
  setUnbiasedDCM(this,dcm);
  KalmanFilterBase::getStateCovariance((Pmatrix *)&local_c0,&(this->filter_).super_KalmanFilterBase)
  ;
  Eigen::Matrix<double,4,4,0,4,4>::Matrix<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (local_a8,(EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_c0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_c0);
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topRightCorner<2,2>
            ((Type *)local_100,(DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)local_a8);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_2,_2,_false>_>::setZero
            (local_100);
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::bottomLeftCorner<2,2>
            ((Type *)local_130,(DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)local_a8);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_2,_2,_false>_>::setZero
            (local_130);
  Vec2ToSqDiag_((Matrix2 *)local_158,uncertainty);
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<2,2>
            ((Type *)local_188,(DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)local_a8);
  Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,2,2,false>::operator=(local_188,local_158);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,4,4,0,4,4>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_1a0,
             (EigenBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_a8);
  KalmanFilterBase::setStateCovariance
            (&(this->filter_).super_KalmanFilterBase,(Pmatrix *)&local_1a0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_1a0);
  return;
}

Assistant:

void LipmDcmEstimator::setUnbiasedDCM(const Vector2 & dcm, const Vector2 & uncertainty)
{
  setUnbiasedDCM(dcm);
  Matrix4 P = filter_.getStateCovariance();
  /// resetting the non diagonal parts
  P.topRightCorner<2, 2>().setZero();
  P.bottomLeftCorner<2, 2>().setZero();
  P.topLeftCorner<2, 2>() = Vec2ToSqDiag_(uncertainty);
  filter_.setStateCovariance(P);
}